

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O1

void __thiscall QHybrid::ComputeWithCachedQValues(QHybrid *this,bool computeIfNotCached)

{
  uint uVar1;
  long lVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  string filenameCache;
  stringstream ss;
  ifstream fp;
  long *local_410;
  long local_408;
  long local_400 [2];
  long *local_3f0;
  long local_3e0 [2];
  long local_3d0;
  long local_3c8;
  stringstream local_3b0 [16];
  ostream local_3a0 [112];
  ios_base local_330 [264];
  long local_228 [2];
  ostream local_218 [16];
  uint auStack_208 [122];
  
  lVar2 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
  (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar2) + 0x40))
            (&local_410,&(this->super_QFunctionJAOHInterface).field_0x0 + lVar2);
  std::__cxx11::stringstream::stringstream(local_3b0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_3a0,(char *)local_410,local_408)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_firstTS",8);
  std::__cxx11::stringbuf::str();
  std::ifstream::ifstream(local_228,(char *)local_3f0,_S_in);
  if (local_3f0 != local_3e0) {
    operator_delete(local_3f0,local_3e0[0] + 1);
  }
  uVar1 = *(uint *)((long)auStack_208 + *(long *)(local_228[0] + -0x18));
  std::ifstream::~ifstream(local_228);
  std::__cxx11::stringstream::~stringstream(local_3b0);
  std::ios_base::~ios_base(local_330);
  if ((uVar1 & 5) == 0 || computeIfNotCached) {
    if ((uVar1 & 5) == 0) {
      puVar4 = (undefined8 *)((long)this->super_QFunctionJAOHInterface + 0x28);
    }
    else {
      (**(code **)((long)this->super_QFunctionJAOHInterface + 0x10))(this);
      puVar4 = (undefined8 *)((long)this->super_QFunctionJAOHInterface + 0x38);
    }
    (*(code *)*puVar4)(this,&local_410);
    if (local_410 != local_400) {
      operator_delete(local_410,local_400[0] + 1);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_228);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_218,"QHybrid::ComputeWithCachedQValues: Q function ",0x2e);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_218,(char *)local_410,local_408)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," not cached, bailing out",0x18);
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar4 = &PTR__E_0059bd80;
  puVar4[1] = puVar4 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar4 + 1),local_3d0,local_3c8 + local_3d0);
  __cxa_throw(puVar4,&E::typeinfo,E::~E);
}

Assistant:

void QHybrid::ComputeWithCachedQValues(bool computeIfNotCached)
{
    string filenameCache=GetCacheFilename();

    // check whether both files exist
    bool cached=true;
    {
        stringstream ss;
        ss << filenameCache << "_firstTS";
        ifstream fp(ss.str().c_str());
        if(!fp)
            cached=false;
    }

    if(!cached && !computeIfNotCached)
    {
        stringstream ss;
        ss << "QHybrid::ComputeWithCachedQValues: Q function "
           << filenameCache << " not cached, bailing out";
        throw(E(ss.str()));
        return;
    }

    // Couldn't open cache file, so compute
    if(!cached)
    {
        Compute();
        Save(filenameCache);
    }
    else // load Q values from file
        Load(filenameCache);
}